

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

bool __thiscall
booster::locale::gnu_gettext::message_key<char>::operator<
          (message_key<char> *this,message_key<char> *other)

{
  int iVar1;
  char_type *l;
  message_key<char> *this_00;
  char_type *in_RDI;
  int cc;
  message_key<char> *in_stack_ffffffffffffffc8;
  undefined1 local_1;
  
  l = context(in_stack_ffffffffffffffc8);
  context(in_stack_ffffffffffffffc8);
  iVar1 = compare(l,in_RDI);
  if (iVar1 == 0) {
    this_00 = (message_key<char> *)key(in_stack_ffffffffffffffc8);
    key(this_00);
    iVar1 = compare(l,in_RDI);
  }
  local_1 = iVar1 < 0;
  return local_1;
}

Assistant:

bool operator < (message_key const &other) const
                {
                    int cc = compare(context(),other.context());
                    if(cc != 0)
                        return cc < 0;
                    return compare(key(),other.key()) < 0;
                }